

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgp_rib.cpp
# Opt level: O3

bool best_path_selection_battle
               (bgp_peer *my_peer,node<adj_ribs_in_data> *me,node<loc_rib_data> *opponent)

{
  byte bVar1;
  uint uVar2;
  adj_ribs_in_data *paVar3;
  attributes *paVar4;
  bool bVar5;
  
  paVar3 = me->data;
  paVar4 = opponent->data->path_attr;
  uVar2 = (paVar3->path_attr).local_pref;
  if (uVar2 != paVar4->local_pref) {
    return paVar4->local_pref < uVar2;
  }
  bVar1 = (paVar3->path_attr).as_path_length;
  bVar5 = bVar1 < paVar4->as_path_length;
  if (((bVar1 == paVar4->as_path_length) &&
      (bVar1 = (paVar3->path_attr).origin, bVar5 = bVar1 < paVar4->origin, bVar1 == paVar4->origin))
     && (uVar2 = (paVar3->path_attr).med, bVar5 = uVar2 < paVar4->med, uVar2 == paVar4->med)) {
    return my_peer->bgp_id <= opponent->data->peer->bgp_id;
  }
  return bVar5;
}

Assistant:

bool best_path_selection_battle(bgp_peer* my_peer, node<adj_ribs_in_data>* me, node<loc_rib_data>* opponent){ // TODO 古い自分のピアとの経路との対決でエラーになりそう
    if(me->data->path_attr.local_pref != opponent->data->path_attr->local_pref){
        if(me->data->path_attr.local_pref > opponent->data->path_attr->local_pref){
            return true;
        }
        return false;
    }
    if(me->data->path_attr.as_path_length != opponent->data->path_attr->as_path_length){
        if(me->data->path_attr.as_path_length < opponent->data->path_attr->as_path_length){
            return true;
        }
        return false;
    }
    if(me->data->path_attr.origin != opponent->data->path_attr->origin){
        if(me->data->path_attr.origin < opponent->data->path_attr->origin){
            return true;
        }
        return false;
    }
    if(me->data->path_attr.med != opponent->data->path_attr->med){
        if(me->data->path_attr.med < opponent->data->path_attr->med){
            return true;
        }
        return false;
    }
    if(my_peer->bgp_id != opponent->data->peer->bgp_id){
        if(my_peer->bgp_id < opponent->data->peer->bgp_id){
            return true;
        }
        return false;
    }
    return true;
}